

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O0

int embree::main(int argc,char **argv)

{
  long lVar1;
  long *plVar2;
  string *name;
  Ref<embree::ParseStream> stream;
  FileName *in_stack_00000a58;
  Ref<embree::ParseStream> *in_stack_00000a60;
  undefined8 in_stack_fffffffffffffe70;
  undefined1 multiLine;
  string *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe80;
  Ref<embree::Stream<int>_> *in_stack_fffffffffffffe88;
  ParseStream *this;
  char **in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffedc;
  CommandLineStream *in_stack_fffffffffffffee0;
  long *local_110;
  undefined1 local_102;
  undefined1 local_101 [40];
  allocator local_d9;
  string local_d8 [38];
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [48];
  string *local_80;
  long *local_78 [3];
  string *local_60;
  string **local_58;
  long *local_50;
  long **local_48;
  string **local_40;
  long **local_30;
  long **local_28;
  long **local_20;
  long **local_10;
  
  multiLine = (undefined1)((ulong)in_stack_fffffffffffffe70 >> 0x38);
  g_device = (RTCDevice)rtcNewDevice(0);
  plVar2 = (long *)operator_new(0x48);
  local_102 = 1;
  name = (string *)operator_new(0x80);
  local_b2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"command line",&local_b1);
  CommandLineStream::CommandLineStream
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed0,name);
  local_b2 = 0;
  local_58 = &local_80;
  local_60 = name;
  local_80 = name;
  if (name != (string *)0x0) {
    (**(code **)(*(long *)name + 0x10))();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"\n\t\r ",&local_d9);
  this = (ParseStream *)local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_101 + 1),"",(allocator *)this);
  ParseStream::ParseStream
            (this,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             (bool)multiLine);
  local_102 = 0;
  local_48 = local_78;
  local_50 = plVar2;
  if (plVar2 != (long *)0x0) {
    lVar1 = *local_78[0];
    local_78[0] = plVar2;
    (**(code **)(lVar1 + 0x10))();
    plVar2 = local_78[0];
  }
  local_78[0] = plVar2;
  std::__cxx11::string::~string((string *)(local_101 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_101);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  local_40 = &local_80;
  if (local_80 != (string *)0x0) {
    (**(code **)(*(long *)local_80 + 0x18))();
  }
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  local_28 = &local_110;
  local_30 = local_78;
  local_110 = local_78[0];
  if (local_78[0] != (long *)0x0) {
    (**(code **)(*local_78[0] + 0x10))();
  }
  FileName::FileName((FileName *)0x10cd09);
  parseCommandLine(in_stack_00000a60,in_stack_00000a58);
  FileName::~FileName((FileName *)0x10cd2f);
  local_20 = &local_110;
  if (local_110 != (long *)0x0) {
    (**(code **)(*local_110 + 0x18))();
  }
  rtcReleaseDevice(g_device);
  g_device = (RTCDevice)0x0;
  local_10 = local_78;
  if (local_78[0] != (long *)0x0) {
    (**(code **)(*local_78[0] + 0x18))();
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) 
  {
    g_device = rtcNewDevice(nullptr);
      
    /* create stream for parsing */
    Ref<ParseStream> stream = new ParseStream(new CommandLineStream(argc, argv));

    /* parse command line */  
    parseCommandLine(stream, FileName());

    rtcReleaseDevice(g_device); g_device = nullptr;
    return 0;
  }